

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::RenderPassCreateInfo::addDependency
          (RenderPassCreateInfo *this,VkSubpassDependency dependency)

{
  vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  allocator<vk::VkSubpassDependency> local_59;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_58;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_50;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> local_48;
  SubpassDependency local_2c;
  RenderPassCreateInfo *local_10;
  RenderPassCreateInfo *this_local;
  
  this_00 = &this->m_dependiences;
  local_10 = this;
  SubpassDependency::SubpassDependency(&local_2c,&dependency);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  push_back(this_00,&local_2c);
  local_50._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
       begin(this_00);
  local_58._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::end
                 (this_00);
  std::allocator<vk::VkSubpassDependency>::allocator(&local_59);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_48,
             local_50,local_58,&local_59);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::operator=
            (&this->m_dependiencesStructs,&local_48);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::~vector(&local_48)
  ;
  std::allocator<vk::VkSubpassDependency>::~allocator(&local_59);
  sVar1 = std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
          size(&this->m_dependiences);
  (this->super_VkRenderPassCreateInfo).dependencyCount = (deUint32)sVar1;
  pvVar2 = std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::
           operator[](&this->m_dependiencesStructs,0);
  (this->super_VkRenderPassCreateInfo).pDependencies = pvVar2;
  return;
}

Assistant:

void
RenderPassCreateInfo::addDependency (vk::VkSubpassDependency dependency)
{

	m_dependiences.push_back(dependency);
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>(m_dependiences.begin(), m_dependiences.end());

	dependencyCount			= static_cast<deUint32>(m_dependiences.size());
	pDependencies			= &m_dependiencesStructs[0];
}